

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

ptrdiff_t __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::reMax
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,int newmax)

{
  int *piVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  Item *newMem;
  Item *local_30;
  
  local_30 = (Item *)0x0;
  for (piVar1 = &this->firstfree; (this->themax ^ *piVar1) != 0xffffffff;
      piVar1 = &this->theitem[~*piVar1].info) {
  }
  if (newmax < this->thesize) {
    newmax = this->thesize;
  }
  *piVar1 = ~newmax;
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>(&local_30,newmax);
  lVar2 = 0;
  for (lVar4 = 0; lVar4 < this->themax; lVar4 = lVar4 + 1) {
    SVSetBase<double>::DLPSV::operator=
              ((DLPSV *)((long)&(local_30->data).super_SVectorBase<double>.m_elem + lVar2),
               (DLPSV *)((long)&(this->theitem->data).super_SVectorBase<double>.m_elem + lVar2));
    *(undefined4 *)((long)&local_30->info + lVar2) =
         *(undefined4 *)((long)&this->theitem->info + lVar2);
    lVar2 = lVar2 + 0x28;
  }
  puVar3 = (undefined8 *)((long)&(local_30->data).super_SVectorBase<double>.m_elem + lVar2);
  for (; lVar4 < newmax; lVar4 = lVar4 + 1) {
    puVar3[2] = 0;
    puVar3[3] = 0;
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[4] = 0;
    puVar3 = puVar3 + 5;
  }
  lVar2 = (long)local_30 - (long)this->theitem;
  spx_free<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>(&this->theitem);
  this->theitem = local_30;
  this->themax = newmax;
  spx_realloc<soplex::DataKey*>(&this->thekey,newmax);
  return lVar2;
}

Assistant:

ptrdiff_t reMax(int newmax = 0)
   {
      int i;
      Item* newMem = nullptr;
      newmax = (newmax < size()) ? size() : newmax;

      int* lastfree = &firstfree;

      while(*lastfree != -themax - 1)
         lastfree = &(theitem[ -1 - *lastfree].info);

      *lastfree = -newmax - 1;

      spx_alloc(newMem, newmax);

      /* call copy constructor for first elements */
      for(i = 0; i < max(); i++)
      {
         newMem[i].data = std::move(theitem[i].data);
         newMem[i].info = theitem[i].info;
      }

      /* call default constructor for remaining elements */
      for(; i < newmax; i++)
         new(&(newMem[i])) Item();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(theitem);

      spx_free(theitem);

      theitem = newMem;
      themax = newmax;

      spx_realloc(thekey,  themax);

      return pshift;
   }